

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::StdGrammarParseData::CreateSymbolMap
          (StdGrammarParseData *this,StdGrammarParseHandler *data,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *symbols,vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   *productions,vector<unsigned_int,_std::allocator<unsigned_int>_> *startSymbols)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
  *this_01;
  char cVar3;
  char cVar4;
  pointer pPVar5;
  key_type *pkVar6;
  key_type kVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  mapped_type_conflict1 *pmVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  mapped_type *this_02;
  iterator iVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  pointer pbVar18;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *p_Var19;
  ulong uVar20;
  undefined1 pright [8];
  _Rb_tree_header *p_Var21;
  char *pcVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symbol;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_03;
  size_t ichain;
  key_type *pkVar23;
  ulong uVar24;
  ulong uVar25;
  size_t ileft;
  pointer __k;
  undefined1 auVar26 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k_00;
  pointer pbVar27;
  ulong uVar28;
  pointer puVar29;
  long lVar30;
  undefined1 local_278 [8];
  Production p;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  reduceData;
  size_t errorCount;
  undefined1 local_158 [8];
  anon_class_16_2_e3ac8062 checkForErrorAndReport;
  undefined1 auStack_128 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rhs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  nonTerminals;
  undefined1 auStack_b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolId;
  undefined1 auStack_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> terminalIds;
  undefined1 auStack_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolErrorTerminal;
  uint local_54;
  uint local_38;
  key_type local_34 [2];
  uint symbolId;
  
  checkForErrorAndReport.this =
       (StdGrammarParseData *)&reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nonTerminals;
  nonTerminals._M_t._M_impl._0_4_ = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  uVar9 = (int)((ulong)((long)(this->UserLex).TokenLexemes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->UserLex).TokenLexemes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2) + 2;
  this_00 = &(this->UserLex).LexemeAliasToToken;
  p_Var1 = &(this->UserLex).LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&(this->UserLex).LexemeNameToToken;
  p_Var2 = &(this->UserLex).LexemeNameToToken._M_t._M_impl.super__Rb_tree_header;
  this_01 = &(this->UserLex).Precedence;
  __k = (data->Productions).
        super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (data->Productions).
           super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  checkForErrorAndReport.errorCount = (size_t *)&data->ProductionLines;
  p_Var21 = &(symbols->_M_t)._M_impl.super__Rb_tree_header;
  local_38 = 0;
  local_158 = (undefined1  [8])this;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
LAB_00128e45:
  if (__k == pPVar5) {
    pkVar6 = (data->OrderedStartSymbols).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pkVar23 = (data->OrderedStartSymbols).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pkVar23 != pkVar6;
        pkVar23 = pkVar23 + 1) {
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,pkVar23);
      if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::operator[](&data->ProductionStartSymbols,pkVar23);
        CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                  ((anon_class_16_2_e3ac8062 *)local_158,*pmVar11,
                   "Undefined production starting symbol %s",(pkVar23->_M_dataplus)._M_p);
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (startSymbols,&iVar12._M_node[2]._M_color);
      }
    }
    bVar8 = reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    return bVar8;
  }
  local_278 = (undefined1  [8])&p.Name._M_string_length;
  p.Name._M_dataplus._M_p = (pointer)0x0;
  p.Name._M_string_length._0_1_ = 0;
  p.Line._4_4_ = 0;
  p.ReduceOverrides._M_t._M_impl._0_4_ = 0;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  p.Line._0_1_ = 0;
  p.Left = 0;
  p.Length = 0;
  p.pRight = (uint *)0x0;
  p.Name.field_2._8_8_ = 0;
  p.Id = 0;
  p.Precedence = 0;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&p.ReduceOverrides;
  p.ConflictActions._M_t._M_impl._0_4_ = 0;
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&p.ConflictActions;
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_128 = (undefined1  [8])0x0;
  rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reduceData._M_t._M_impl._0_4_ = 0;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&reduceData;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                          *)checkForErrorAndReport.errorCount,&__k->Name);
  terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)*pmVar11;
  uVar25 = 0;
  local_54 = 0;
LAB_00128f3c:
  pbVar27 = (__k->Right).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar18 = (__k->Right).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar20 = (long)pbVar18 - (long)pbVar27 >> 5;
  if (uVar25 < uVar20) {
    pcVar22 = pbVar27[uVar25]._M_dataplus._M_p;
    cVar3 = *pcVar22;
    if (cVar3 != '*') {
      __k_00 = pbVar27 + uVar25;
      if (cVar3 == '$') {
        std::__cxx11::string::substr((ulong)auStack_b8,(ulong)__k_00);
        std::__cxx11::string::operator=((string *)__k_00,(string *)auStack_b8);
        std::__cxx11::string::~string((string *)auStack_b8);
        pcVar22 = (__k_00->_M_dataplus)._M_p;
      }
      local_34[0] = 0xffffffff;
      if (*pcVar22 == '%') {
        if (pcVar22[6] != '(') goto LAB_0012903f;
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&symbols->_M_t,__k_00);
        if ((_Rb_tree_header *)iVar12._M_node == p_Var21) {
          local_34[0] = uVar9 | 0x40000000;
          uVar9 = uVar9 + 1;
          goto LAB_0012906f;
        }
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](symbols,__k_00);
      }
      else if (*pcVar22 == '\'') {
        std::__cxx11::string::substr((ulong)auStack_b8,(ulong)__k_00);
        std::__cxx11::string::operator=((string *)__k_00,(string *)auStack_b8);
        std::__cxx11::string::~string((string *)auStack_b8);
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&this_00->_M_t,__k_00);
        if ((_Rb_tree_header *)iVar12._M_node == p_Var1) {
          CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                    ((anon_class_16_2_e3ac8062 *)local_158,
                     (size_t)terminalIds.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                     "Undefined alias referenced - \'%s\'",(__k_00->_M_dataplus)._M_p);
          goto LAB_0012906f;
        }
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[](this_00,__k_00);
      }
      else {
LAB_0012903f:
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,__k_00);
        if ((_Rb_tree_header *)iVar12._M_node == p_Var2) {
          bVar8 = std::operator==(__k_00,"%error");
          if (bVar8) {
            local_34[0] = 0;
          }
          else {
            bVar8 = std::operator==(__k_00,"%error_backtrack");
            if (bVar8) {
              local_34[0] = 0x20000000;
            }
          }
          goto LAB_0012906f;
        }
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                *)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               __k_00);
      }
      local_34[0] = *pmVar13;
LAB_0012906f:
      bVar8 = false;
      do {
        lVar30 = uVar25 * 0x20;
        while( true ) {
          uVar25 = uVar25 + 1;
          pbVar27 = (__k->Right).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((ulong)((long)(__k->Right).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27 >> 5) <=
               uVar25) || ((**(byte **)((long)&pbVar27[1]._M_dataplus._M_p + lVar30) | 2) != 0x3e))
          {
            if (bVar8) {
              CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                        ((anon_class_16_2_e3ac8062 *)local_158,
                         (size_t)terminalIds.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                         "Conflict actions before nonterminal %s",(__k_00->_M_dataplus)._M_p);
            }
            if (local_34[0] == 0xffffffff) {
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)&rhs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,__k_00);
              if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)&rhs.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,__k_00
                                      );
                *pmVar13 = local_38;
                local_38 = local_38 + 1;
              }
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)&rhs.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,__k_00);
              local_34[0] = *pmVar13;
            }
            else {
              local_34[0] = local_34[0] | 0x80000000;
              iVar16 = std::
                       _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
                       ::find(&this_01->_M_t,local_34);
              if ((_Rb_tree_header *)iVar16._M_node ==
                  &(this->UserLex).Precedence._M_t._M_impl.super__Rb_tree_header) {
                local_54 = 0;
              }
              else {
                pmVar17 = std::
                          map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
                          ::operator[](this_01,local_34);
                local_54 = pmVar17->Value & 0x3fffffff;
              }
            }
            if (cVar3 != '$') {
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find(&symbols->_M_t,__k_00);
              kVar7 = local_34[0];
              if ((_Rb_tree_header *)iVar12._M_node == p_Var21) {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[](symbols,__k_00);
                *pmVar13 = kVar7;
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128,local_34
                        );
            }
            goto LAB_00128f3c;
          }
          if (local_34[0] == 0xffffffff) break;
          uVar20 = (long)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                         .super__Vector_impl_data._M_start - (long)auStack_128;
          std::__cxx11::string::substr
                    ((ulong)auStack_b8,(long)&pbVar27[1]._M_dataplus._M_p + lVar30);
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (key_type *)auStack_b8);
          if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    *)&rhs.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)auStack_b8);
            *pmVar13 = local_38;
            local_38 = local_38 + 1;
          }
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&rhs.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (key_type *)auStack_b8);
          auStack_78._0_4_ = *pmVar13;
          auStack_98._0_4_ = (int)(uVar20 >> 2);
          this_02 = std::
                    map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                    ::operator[]((map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                                  *)&p.LeftChain.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (key_type *)auStack_98);
          iVar14 = std::
                   _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
                   ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>,_std::_Select1st<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
                           *)this_02,(key_type *)auStack_78);
          if ((_Rb_tree_header *)iVar14._M_node ==
              &(this_02->Actions)._M_t._M_impl.super__Rb_tree_header) {
            cVar4 = **(char **)((long)&(__k->Right).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               + lVar30);
            pmVar15 = std::
                      map<unsigned_int,_SGParser::Generator::Production::ConflictAction::Action,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
                      ::operator[](&this_02->Actions,(key_type *)auStack_78);
            *pmVar15 = (uint)(cVar4 != '>');
          }
          else {
            CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                      ((anon_class_16_2_e3ac8062 *)local_158,
                       (size_t)terminalIds.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Multiple conflict actions on nonterminal %s before \'%s\'",auStack_b8,
                       (__k_00->_M_dataplus)._M_p);
          }
          std::__cxx11::string::~string((string *)auStack_b8);
          lVar30 = lVar30 + 0x20;
        }
        bVar8 = true;
      } while( true );
    }
    auStack_78 = (undefined1  [8])0x0;
    leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_98 = (undefined1  [8])0x0;
    terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar28 = uVar25;
    goto LAB_00129385;
  }
  goto LAB_0012960d;
LAB_00129385:
  puVar29 = leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  auVar26 = auStack_78;
  if ((ulong)((long)pbVar18 - (long)pbVar27 >> 5) <= uVar28) goto LAB_001295b7;
  pkVar23 = pbVar27 + uVar28;
  cVar3 = *pbVar27[uVar28]._M_dataplus._M_p;
  if (cVar3 == '*') {
    for (; auVar26 != (undefined1  [8])puVar29; auVar26 = (undefined1  [8])((long)auVar26 + 4)) {
      auStack_b8._0_4_ = *(uint *)auVar26;
      p_Var19 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 *)std::
                   map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                 *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,(key_type *)auStack_b8);
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (p_Var19,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )auStack_98,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start);
    }
    if ((undefined1  [8])
        leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != auStack_78) {
      leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
    }
    if ((undefined1  [8])
        terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != auStack_98) {
      terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auStack_98;
    }
    std::__cxx11::string::substr((ulong)auStack_b8,(ulong)pkVar23);
    std::__cxx11::string::operator=((string *)pkVar23,(string *)auStack_b8);
    std::__cxx11::string::~string((string *)auStack_b8);
LAB_001294f8:
    iVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,pkVar23);
    if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pkVar23);
      *pmVar13 = local_38;
      local_38 = local_38 + 1;
    }
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,pkVar23);
    local_34[0] = *pmVar13;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,local_34);
  }
  else {
    if (cVar3 != '+') goto LAB_001294f8;
    std::__cxx11::string::substr((ulong)auStack_b8,(ulong)pkVar23);
    std::__cxx11::string::operator=((string *)pkVar23,(string *)auStack_b8);
    std::__cxx11::string::~string((string *)auStack_b8);
    this_03 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (*(pkVar23->_M_dataplus)._M_p == '\'') {
      std::__cxx11::string::substr((ulong)auStack_b8,(ulong)pkVar23);
      std::__cxx11::string::operator=((string *)pkVar23,(string *)auStack_b8);
      std::__cxx11::string::~string((string *)auStack_b8);
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find(&this_00->_M_t,pkVar23);
      pcVar22 = "Undefined terminal alias referenced - \'%s\' inside of the %reduce()";
      this_03 = this_00;
      if ((_Rb_tree_header *)iVar12._M_node != p_Var1) goto LAB_00129575;
LAB_00129441:
      CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                ((anon_class_16_2_e3ac8062 *)local_158,
                 (size_t)terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar22,
                 (pkVar23->_M_dataplus)._M_p);
    }
    else {
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,pkVar23);
      pcVar22 = "Undefined terminal referenced - \'%s\' inside of the %reduce()";
      if ((_Rb_tree_header *)iVar12._M_node == p_Var2) goto LAB_00129441;
LAB_00129575:
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](this_03,pkVar23);
      local_34[0] = *pmVar13 | 0x80000000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98,local_34);
    }
  }
  uVar28 = uVar28 + 1;
  pbVar27 = (__k->Right).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar18 = (__k->Right).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  goto LAB_00129385;
LAB_001295b7:
  for (; auVar26 != (undefined1  [8])puVar29; auVar26 = (undefined1  [8])((long)auVar26 + 4)) {
    auStack_b8._0_4_ = *(uint *)auVar26;
    p_Var19 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
               *)std::
                 map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                               *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count
                              ,(key_type *)auStack_b8);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (p_Var19,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )auStack_98,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_98);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78);
LAB_0012960d:
  auStack_b8 = (undefined1  [8])0x0;
  leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar28 = 0;
LAB_0012962a:
  puVar29 = (pointer)(uVar28 << 5);
  while( true ) {
    puVar29 = puVar29 + 8;
    pbVar27 = (__k->Left).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(__k->Left).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27 >> 5) <= uVar28)
    break;
    pkVar23 = (key_type *)((long)puVar29 + (long)(pbVar27 + -1));
    iVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,pkVar23);
    terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar29;
    if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
      local_34[0] = local_38;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pkVar23);
      kVar7 = local_34[0];
      *pmVar13 = local_38;
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[](symbols,pkVar23);
      local_38 = local_38 + 1;
      *pmVar13 = kVar7;
    }
    else {
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)&rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pkVar23);
      local_34[0] = *pmVar13;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_b8,local_34);
    puVar29 = terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    pbVar27 = (__k->Left).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar28 + 1 <
         (ulong)((long)(__k->Left).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27 >> 5)) &&
       (**(char **)((long)&(pbVar27->_M_dataplus)._M_p +
                   (long)terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) == '%'))
    goto LAB_0012971d;
    auStack_98 = (undefined1  [8])((ulong)auStack_98 & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,(uint *)auStack_98)
    ;
    uVar28 = uVar28 + 1;
  }
  for (uVar28 = 0;
      puVar29 = rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start, auVar26 = auStack_128,
      uVar28 < (ulong)((long)leftSymbolId.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start - (long)auStack_b8 >> 2);
      uVar28 = uVar28 + 1) {
    uVar10 = *(uint *)((long)auStack_b8 + uVar28 * 4);
    local_34[0] = uVar10;
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            *)checkForErrorAndReport.errorCount,&__k->Name);
    uVar24 = (long)puVar29 - (long)auVar26;
    pright = (undefined1  [8])(uint *)0x0;
    if (uVar24 != 0) {
      pright = auVar26;
    }
    Production::SetProduction
              ((Production *)local_278,&__k->Name,uVar10,(uint *)pright,(uint)(uVar24 >> 2),*pmVar11
               ,local_54);
    p.Line._4_4_ = *(pointer)((long)auStack_78 + uVar28 * 4);
    if (p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    lVar30 = 0;
    for (uVar24 = 0;
        uVar24 < (ulong)((long)leftSymbolId.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start - (long)auStack_b8 >> 2);
        uVar24 = uVar24 + 1) {
      if (uVar28 != uVar24) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (value_type_conflict2 *)((long)auStack_b8 + lVar30));
      }
      lVar30 = lVar30 + 4;
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             *)&p.NotReported);
    if (uVar25 < uVar20) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
      ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   *)&p.NotReported,
                  (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    if (__k->NotReported == true) {
      p.Line._0_1_ = 1;
    }
    std::vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>::
    push_back(productions,(value_type *)local_278);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_b8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
               *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_128);
  Production::~Production((Production *)local_278);
  __k = __k + 1;
  goto LAB_00128e45;
LAB_0012971d:
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::find(&symbols->_M_t,
                  (key_type *)
                  ((long)&(pbVar27->_M_dataplus)._M_p +
                  (long)terminalIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage));
  if ((_Rb_tree_header *)iVar12._M_node == p_Var21) {
    uVar10 = uVar9 | 0x40000000;
    uVar9 = uVar9 + 1;
  }
  else {
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::operator[](symbols,(key_type *)
                                   ((long)puVar29 +
                                   (long)(__k->Left).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
    uVar10 = *pmVar13;
  }
  auStack_98._0_4_ = uVar10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,(uint *)auStack_98);
  uVar28 = uVar28 + 2;
  goto LAB_0012962a;
}

Assistant:

bool StdGrammarParseData::CreateSymbolMap(StdGrammarParseHandler& data,
                                          std::map<String, unsigned>& symbols,
                                          std::vector<Production>& productions,
                                          std::vector<unsigned>& startSymbols) {
    size_t errorCount = 0u;

    // Check for an error and report if needed
    const auto checkForErrorAndReport = [&](size_t line, const char* text...) {
        if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
            va_list argList;
            va_start(argList, text);
            const auto msgText = StringWithVAFormat(text, argList);
            va_end(argList);

            const ParseMessage msg{ParseMessage::ErrorMessage, "", msgText, 0u, line};
            Messages.AddMessage(msg);
        }
        ++errorCount;
    };

    std::map<String, unsigned> nonTerminals;

    // NonTerminal id counter
    auto idCounter         = 0u;
    // Terminal id counter - extra terminals will be added to handle %error(Name)
    auto terminalIdCounter = unsigned(UserLex.TokenLexemes.size()) + TokenCode::TokenFirstID;

    for (auto& prod: data.Productions) {
        Production                             p;
        std::vector<unsigned>                  rhs;
        std::map<unsigned, std::set<unsigned>> reduceData;
        unsigned symbolId;
        unsigned precValue   = 0u;
        bool     reduceValue = false;
        size_t   iright;
        auto&    left        = prod.Left;
        auto&    right       = prod.Right;
        size_t   line        = data.ProductionLines[prod.Name];

        // Form right hand side list
        for (iright = 0u; iright < right.size(); ++iright) {
            bool  prec   = false;
            auto& symbol = right[iright];

            // Check to see if it is the beginning of the reduce overrides
            if (symbol[0u] == '*') {
                reduceValue = true;
                break;
            }

            // Check for precedence
            if (symbol[0u] == '$') {
                // Eat precedence marker '$'
                symbol = symbol.substr(1u);
                prec   = true;
            }

            // Search to see if it is a terminal
            symbolId = NFA::InvalidLexeme;
            // Terminal alias references will have special ' marker up front
            if (symbol[0u] == '\'') {
                // Eat alias marker quote
                symbol = symbol.substr(1u);

                if (UserLex.LexemeAliasToToken.find(symbol) != UserLex.LexemeAliasToToken.end())
                    symbolId = UserLex.LexemeAliasToToken[symbol];
                else
                    // ERROR: Undefined alias referenced
                    checkForErrorAndReport(line, "Undefined alias referenced - '%s'",
                                           symbol.data());
            } else {
                // If symbol has a % in front of it, it must be one of %error( ) directives
                if (symbol[0u] == '%' && symbol[6u] == '(') {
                    // Must be %error(Name)
                    // Make an error terminal, and reference it
                    // Assign it an Id, so it will be stored as a terminal in Symbols
                    if (symbols.find(symbol) == symbols.end())
                        symbolId = terminalIdCounter++ | ProductionMask::ErrorTerminal;
                    else
                        symbolId = symbols[symbol];
                } else {
                    // Standard terminal processing
                    // See if this is a terminal name declared in expressions
                    if (UserLex.LexemeNameToToken.find(symbol) != UserLex.LexemeNameToToken.end())
                        symbolId = UserLex.LexemeNameToToken[symbol];
                    // Special terminal - error, code TokenCode::TCode::TokenError
                    else if (symbol == "%error")
                        symbolId = TokenCode::TokenError;
                    else if (symbol == "%error_backtrack")
                        symbolId = TokenCode::TokenError | ProductionMask::BacktrackError;
                    else {} // Otherwise it is an error
                }
            }

            // Read in any conflict actions
            bool conflictActionsError = false;

            while (iright + 1u < right.size() &&
                   (right[iright + 1u][0u] == '>' || right[iright + 1u][0u] == '<')) {
                ++iright;
                // Terminal must follow %shifton, %reduceon
                if (symbolId != NFA::InvalidLexeme) {
                    // Get nonterminal id
                    unsigned   id;
                    const auto index = rhs.size();
                    const auto s     = right[iright].substr(1u);

                    // Get Nonterminal Id
                    // If this nonterminal wasn't seen yet, assign it an id
                    if (nonTerminals.find(s) == nonTerminals.end())
                        nonTerminals[s] = idCounter++;
                    id = nonTerminals[s];

                    // Make sure there isn't an action on this nonterminal already
                    Production::ConflictAction & action = p.ConflictActions[unsigned(index)];
                    if (action.Actions.find(id) != action.Actions.end())
                        // Error: Multiple conflict
                        checkForErrorAndReport(line,
                                               "Multiple conflict actions on nonterminal %s before '%s'",
                                               s.data(), symbol.data());
                    else
                        // Store action
                        action.Actions[id] = right[iright][0u] == '>'
                                                 ? Production::ConflictAction::Action::Shift
                                                 : Production::ConflictAction::Action::Reduce;
                } else
                    // Conflict actions can only appear before a terminal
                    conflictActionsError = true;
            }

            // Conflict actions defined for nonterminal
            if (conflictActionsError)
                // Error: Multiple conflict actions
                checkForErrorAndReport(line, "Conflict actions before nonterminal %s",
                                       symbol.data());

            // Terminal - mark it with Terminal flag
            if (symbolId != NFA::InvalidLexeme) {
                symbolId |= ProductionMask::Terminal;

                // Get the precedence value
                if (UserLex.Precedence.find(symbolId) != UserLex.Precedence.end())
                    precValue = UserLex.Precedence[symbolId].Value &
                                Grammar::TerminalPrec::PrecMask;
                else
                    precValue = 0u;
            } else {
                // It's a nonterminal
                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];
            }

            if (!prec) {
                // Make sure to add it to grammarSymbols
                if (symbols.find(symbol) == symbols.end())
                    symbols[symbol] = symbolId;

                // And store Id into production
                rhs.push_back(symbolId);
            }
        }

        // Build reduce overrides map
        if (reduceValue) {
            std::vector<unsigned> nonTerminalIds;
            std::vector<unsigned> terminalIds;

            for (auto ireduce = iright; ireduce < right.size(); ++ireduce) {
                auto& symbol = right[ireduce];

                // It is a terminal
                if (symbol[0u] == '+') {
                    symbol = symbol.substr(1u);
                    // Terminal alias references will have special ' marker up front
                    if (symbol[0u] == '\'') {
                        // Eat alias marker quote
                        symbol = symbol.substr(1u);

                        if (UserLex.LexemeAliasToToken.find(symbol) !=
                            UserLex.LexemeAliasToToken.end()) {
                            symbolId = UserLex.LexemeAliasToToken[symbol] |
                                       ProductionMask::Terminal;
                            terminalIds.push_back(symbolId);
                        } else
                            // ERROR: Undefined terminal alias referenced
                            checkForErrorAndReport(line,
                                                   "Undefined terminal alias referenced - '%s' inside of the %reduce()",
                                                   symbol.data());
                    } else if (UserLex.LexemeNameToToken.find(symbol) !=
                               UserLex.LexemeNameToToken.end()) {
                        symbolId = UserLex.LexemeNameToToken[symbol] | ProductionMask::Terminal;
                        terminalIds.push_back(symbolId);
                    } else
                        // ERROR: Undefined terminal referenced
                        checkForErrorAndReport(line,
                                               "Undefined terminal referenced - '%s' inside of the %reduce()",
                                               symbol.data());
                    continue;
                }

                // It is the first Nonterminal in the set
                if (symbol[0u] == '*') {
                    // store the last reduce data
                    for (const auto nonterm: nonTerminalIds)
                        reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());

                    // Reset the arrays
                    nonTerminalIds.clear();
                    terminalIds.clear();

                    // Eat the '*' marker
                    symbol = symbol.substr(1u);
                }

                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];

                nonTerminalIds.push_back(symbolId);
            }

            // Store the last reduce data
            for (const auto nonterm: nonTerminalIds)
                reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());
        }

        // Build an array of LHS nonterminal symbol ids
        std::vector<unsigned> leftSymbolId;
        std::vector<unsigned> leftSymbolErrorTerminal;

        for (size_t ileft = 0u; ileft < left.size(); ++ileft) {
            // Store & get id for Left nonterminal
            const auto& symbol = left[ileft];

            if (nonTerminals.find(symbol) != nonTerminals.end())
                symbolId = nonTerminals[symbol];
            else {
                // Assign nonterminal Id
                symbolId = idCounter++;
                nonTerminals[symbol] = symbolId;
                // And record nonterminal symbol
                symbols[symbol]      = symbolId;
            }
            leftSymbolId.push_back(symbolId);

            // If we have associated %error
            if (ileft + 1u < left.size() && left[ileft + 1u][0u] == '%') {
                // Store error terminal's symbol id (might need to assign a new one)
                leftSymbolErrorTerminal.push_back(
                    symbols.find(left[ileft + 1u]) == symbols.end()
                        ? terminalIdCounter++ | ProductionMask::ErrorTerminal
                        : symbols[left[ileft + 1u]]);
                ++ileft;
            } else
                leftSymbolErrorTerminal.push_back(0);
        }

        // Store a production for all left hand side nonterminals
        for (size_t ileft = 0u; ileft < leftSymbolId.size(); ++ileft) {
            // Get the symbol id
            symbolId = leftSymbolId[ileft];

            // Finally store production value
            unsigned* const rght = rhs.size() ? &rhs[0] : nullptr;
            p.SetProduction(prod.Name, symbolId, rght, unsigned(rhs.size()),
                            data.ProductionLines[prod.Name], precValue);
            p.ErrorTerminal = leftSymbolErrorTerminal[ileft];

            // Build the left hand chain
            p.LeftChain.clear();
            for (size_t ichain = 0u; ichain < leftSymbolId.size(); ++ichain)
                // Make sure not to add the same nonterminal
                if (ichain != ileft)
                    p.LeftChain.push_back(leftSymbolId[ichain]);

            // Add the reduce overrides data
            p.ReduceOverrides.clear();
            if (reduceValue)
                p.ReduceOverrides = reduceData;

            // If its an action production don't report it
            if (prod.NotReported)
                p.NotReported = true;

            productions.push_back(p);
        }
    }

    // Process starting symbols
    for (const auto& symbol: data.OrderedStartSymbols)
        if (const auto inonTerminals = nonTerminals.find(symbol);
            inonTerminals == nonTerminals.end())
            // Error: Undefined production start symbol
            checkForErrorAndReport(data.ProductionStartSymbols[symbol],
                                   "Undefined production starting symbol %s", symbol.data());
        else
            // Store starting production's nonterminal Id
            startSymbols.push_back(inonTerminals->second);

    return errorCount == 0u;
}